

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

int bcm2835_close(void)

{
  if (debug == '\0') {
    unmapmem(&bcm2835_peripherals,bcm2835_peripherals_size);
    bcm2835_peripherals = (uint32_t *)0xffffffffffffffff;
    bcm2835_gpio = (uint32_t *)0xffffffffffffffff;
    bcm2835_pwm = (uint32_t *)0xffffffffffffffff;
    bcm2835_clk = (uint32_t *)0xffffffffffffffff;
    bcm2835_pads = (uint32_t *)0xffffffffffffffff;
    bcm2835_spi0 = (uint32_t *)0xffffffffffffffff;
    bcm2835_bsc0 = (uint32_t *)0xffffffffffffffff;
    bcm2835_bsc1 = (uint32_t *)0xffffffffffffffff;
    bcm2835_st = (uint32_t *)0xffffffffffffffff;
    bcm2835_aux = (uint32_t *)0xffffffffffffffff;
    bcm2835_spi1 = (uint32_t *)0xffffffffffffffff;
  }
  return 1;
}

Assistant:

int bcm2835_close(void)
{
    if (debug) return 1; /* Success */

    unmapmem((void**) &bcm2835_peripherals, bcm2835_peripherals_size);
    bcm2835_peripherals = MAP_FAILED;
    bcm2835_gpio = MAP_FAILED;
    bcm2835_pwm  = MAP_FAILED;
    bcm2835_clk  = MAP_FAILED;
    bcm2835_pads = MAP_FAILED;
    bcm2835_spi0 = MAP_FAILED;
    bcm2835_bsc0 = MAP_FAILED;
    bcm2835_bsc1 = MAP_FAILED;
    bcm2835_st   = MAP_FAILED;
    bcm2835_aux  = MAP_FAILED;
    bcm2835_spi1 = MAP_FAILED;
    return 1; /* Success */
}